

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockPluginTest.cpp
# Opt level: O1

void __thiscall
TEST_MockPlugin_checkExpectationsAndClearAtEnd_Test::testBody
          (TEST_MockPlugin_checkExpectationsAndClearAtEnd_Test *this)

{
  uint uVar1;
  MockSupport *pMVar2;
  UtestShell *pUVar3;
  char *pcVar4;
  char *pcVar5;
  TestTerminator *pTVar6;
  MockFailureReporterInstaller failureReporterInstaller;
  MockExpectedCallsListForTest expectations;
  MockExpectedCallsDidntHappenFailure expectedFailure;
  MockFailureReporterInstaller local_b9;
  undefined1 local_b8 [152];
  
  MockFailureReporterInstaller::MockFailureReporterInstaller(&local_b9);
  MockExpectedCallsList::MockExpectedCallsList((MockExpectedCallsList *)(local_b8 + 0x10));
  local_b8._16_8_ = &PTR__MockExpectedCallsListForTest_002aaff0;
  SimpleString::SimpleString((SimpleString *)(local_b8 + 0x30),"foobar");
  MockExpectedCallsListForTest::addFunction
            ((MockExpectedCallsListForTest *)(local_b8 + 0x10),(SimpleString *)(local_b8 + 0x30));
  SimpleString::~SimpleString((SimpleString *)(local_b8 + 0x30));
  MockExpectedCallsDidntHappenFailure::MockExpectedCallsDidntHappenFailure
            ((MockExpectedCallsDidntHappenFailure *)(local_b8 + 0x30),
             (this->super_TEST_GROUP_CppUTestGroupMockPlugin).test,
             (MockExpectedCallsList *)(local_b8 + 0x10));
  SimpleString::SimpleString((SimpleString *)local_b8,"");
  pMVar2 = mock((SimpleString *)local_b8,(MockFailureReporter *)0x0);
  SimpleString::SimpleString((SimpleString *)(local_b8 + 0x20),"foobar");
  (*pMVar2->_vptr_MockSupport[3])(pMVar2,local_b8 + 0x20);
  SimpleString::~SimpleString((SimpleString *)(local_b8 + 0x20));
  SimpleString::~SimpleString((SimpleString *)local_b8);
  MockSupportPlugin::postTestAction
            (&(this->super_TEST_GROUP_CppUTestGroupMockPlugin).plugin,
             (this->super_TEST_GROUP_CppUTestGroupMockPlugin).test,
             (this->super_TEST_GROUP_CppUTestGroupMockPlugin).result);
  pUVar3 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)local_b8);
  pcVar4 = SimpleString::asCharString((SimpleString *)local_b8);
  pcVar5 = SimpleString::asCharString
                     (&(this->super_TEST_GROUP_CppUTestGroupMockPlugin).output.output);
  (*pUVar3->_vptr_UtestShell[0xc])
            (pUVar3,pcVar4,pcVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockPluginTest.cpp"
             ,0x46);
  SimpleString::~SimpleString((SimpleString *)local_b8);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString((SimpleString *)local_b8,"");
  pMVar2 = mock((SimpleString *)local_b8,(MockFailureReporter *)0x0);
  uVar1 = (*pMVar2->_vptr_MockSupport[0x26])(pMVar2);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,0,(ulong)(uVar1 & 0xff),"LONGS_EQUAL(0, mock().expectedCallsLeft()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockPluginTest.cpp"
             ,0x47,pTVar6);
  SimpleString::~SimpleString((SimpleString *)local_b8);
  CHECK_NO_MOCK_FAILURE_LOCATION
            ("/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockPluginTest.cpp"
             ,0x48);
  TestFailure::~TestFailure((TestFailure *)(local_b8 + 0x30));
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)(local_b8 + 0x10));
  MockFailureReporterInstaller::~MockFailureReporterInstaller(&local_b9);
  return;
}

Assistant:

TEST(MockPlugin, checkExpectationsAndClearAtEnd)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foobar");
    MockExpectedCallsDidntHappenFailure expectedFailure(test, expectations);

    mock().expectOneCall("foobar");

    plugin.postTestAction(*test, *result);

    STRCMP_CONTAINS(expectedFailure.getMessage().asCharString(), output.getOutput().asCharString());
    LONGS_EQUAL(0, mock().expectedCallsLeft());
    CHECK_NO_MOCK_FAILURE();
}